

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeTypedArrayConstructor
               (DynamicObject *typedArrayConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  uint uVar4;
  StaticType *type;
  LiteralString *pLVar1;
  RuntimeFunction *pRVar2;
  RuntimeFunction *pRVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,typedArrayConstructor,mode,5,0);
  this = (((typedArrayConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0xd1,&DAT_1000000000003,2,0,0,uVar5);
  type = StringCache::GetStringTypeStatic(&this->stringCache);
  pLVar1 = LiteralString::New(type,L"TypedArray",10,this->recycler);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0x106,pLVar1,2,0,0,uVar5);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0x124,(this->super_JavascriptLibraryBase).typedArrayPrototype.ptr
             ,0,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::From,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x95);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0x95,pRVar2,6,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Of,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x11c);
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0x11c,pRVar2,6,0,0,uVar5 & 0xffffffff00000000);
  pRVar3 = CreateGetterFunction
                     (this,0x2c6,(FunctionInfo *)TypedArrayBase::EntryInfo::GetterSymbolSpecies);
  pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = pRVar2;
  }
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (typedArrayConstructor,0x19,pRVar3,pRVar2,0);
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(typedArrayConstructor,0x19,6);
  DynamicObject::SetHasNoEnumerableProperties(typedArrayConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeTypedArrayConstructor(DynamicObject* typedArrayConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(typedArrayConstructor, mode, 5);

        JavascriptLibrary* library = typedArrayConstructor->GetLibrary();

        library->AddMember(typedArrayConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(3), PropertyConfigurable);
        library->AddMember(typedArrayConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("TypedArray")), PropertyConfigurable);
        library->AddMember(typedArrayConstructor, PropertyIds::prototype, library->typedArrayPrototype, PropertyNone);

        library->AddFunctionToLibraryObject(typedArrayConstructor, PropertyIds::from, &TypedArrayBase::EntryInfo::From, 1);
        library->AddFunctionToLibraryObject(typedArrayConstructor, PropertyIds::of, &TypedArrayBase::EntryInfo::Of, 0);
        library->AddSpeciesAccessorsToLibraryObject(typedArrayConstructor, &TypedArrayBase::EntryInfo::GetterSymbolSpecies);

        typedArrayConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }